

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

vector<KTX_header2,_std::allocator<KTX_header2>_> * __thiscall
ktx::CommandCompare::read<KTX_header2>
          (vector<KTX_header2,_std::allocator<KTX_header2>_> *__return_storage_ptr__,
          CommandCompare *this,InputStreams *streams,size_t offset,string_view what)

{
  pointer pKVar1;
  long lVar2;
  value_type *__val;
  
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pKVar1 = (pointer)operator_new(0xa0);
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_start = pKVar1;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_finish = pKVar1;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pKVar1 + 2;
  pKVar1->identifier[0] = '\0';
  pKVar1->identifier[1] = '\0';
  pKVar1->identifier[2] = '\0';
  pKVar1->identifier[3] = '\0';
  pKVar1->identifier[4] = '\0';
  pKVar1->identifier[5] = '\0';
  pKVar1->identifier[6] = '\0';
  pKVar1->identifier[7] = '\0';
  *(undefined8 *)(pKVar1->identifier + 8) = 0;
  pKVar1->typeSize = 0;
  pKVar1->pixelWidth = 0;
  pKVar1->pixelHeight = 0;
  pKVar1->pixelDepth = 0;
  pKVar1->layerCount = 0;
  pKVar1->faceCount = 0;
  pKVar1->levelCount = 0;
  pKVar1->supercompressionScheme = 0;
  (pKVar1->dataFormatDescriptor).byteOffset = 0;
  (pKVar1->dataFormatDescriptor).byteLength = 0;
  (pKVar1->keyValueData).byteOffset = 0;
  (pKVar1->keyValueData).byteLength = 0;
  (pKVar1->supercompressionGlobalData).byteOffset = 0;
  (pKVar1->supercompressionGlobalData).byteLength = 0;
  pKVar1[1].supercompressionGlobalData.byteOffset = 0;
  pKVar1[1].supercompressionGlobalData.byteLength = 0;
  pKVar1[1].dataFormatDescriptor.byteOffset = 0;
  pKVar1[1].dataFormatDescriptor.byteLength = 0;
  pKVar1[1].keyValueData.byteOffset = 0;
  pKVar1[1].keyValueData.byteLength = 0;
  pKVar1[1].layerCount = 0;
  pKVar1[1].faceCount = 0;
  pKVar1[1].levelCount = 0;
  pKVar1[1].supercompressionScheme = 0;
  pKVar1[1].typeSize = 0;
  pKVar1[1].pixelWidth = 0;
  pKVar1[1].pixelHeight = 0;
  pKVar1[1].pixelDepth = 0;
  pKVar1[1].identifier[0] = '\0';
  pKVar1[1].identifier[1] = '\0';
  pKVar1[1].identifier[2] = '\0';
  pKVar1[1].identifier[3] = '\0';
  pKVar1[1].identifier[4] = '\0';
  pKVar1[1].identifier[5] = '\0';
  pKVar1[1].identifier[6] = '\0';
  pKVar1[1].identifier[7] = '\0';
  *(undefined8 *)(pKVar1[1].identifier + 8) = 0;
  (__return_storage_ptr__->super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
  super__Vector_impl_data._M_finish = pKVar1 + 2;
  lVar2 = 0;
  do {
    read(this,(int)streams,(void *)offset,(size_t)(pKVar1->identifier + lVar2));
    lVar2 = lVar2 + 0x50;
    streams = (InputStreams *)&streams->field_0x3b8;
  } while (lVar2 == 0x50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> read(InputStreams& streams, std::size_t offset, std::string_view what) {
        std::vector<T> result(streams.size());
        for (std::size_t i = 0; i < streams.size(); ++i) {
            read(streams[i], offset, &result[i], sizeof(T), what);
        }
        return result;
    }